

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values.h
# Opt level: O0

content<double> * __thiscall mpt::value_store::reserve<double>(value_store *this,long count)

{
  int local_3c;
  int type;
  buffer *buf;
  long count_local;
  value_store *this_local;
  
  if ((reserve<double>::traits == (type_traits *)0x0) &&
     (reserve<double>::traits = type_properties<double>::traits(),
     reserve<double>::traits == (type_traits *)0x0)) {
    this_local = (value_store *)0x0;
  }
  else {
    this_local = (value_store *)mpt::value_store::reserve((long)this,(type_traits *)count);
    if (this_local != (value_store *)0x0) {
      local_3c = type_properties<double>::id(false);
      if (local_3c < 1) {
        local_3c = 0;
      }
      this->_type = (uint16_t)local_3c;
    }
  }
  return (content<double> *)this_local;
}

Assistant:

content<T> *reserve(long count = 0)
	{
		static const struct type_traits *traits = 0;
		if (!traits && !(traits = type_properties<T>::traits())) {
			return 0;
		}
		buffer *buf = reserve(count, *traits);
		if (buf) {
			/* type ID registration may take place during runtime */
			int type = type_properties<T>::id(false);
			_type = (type > 0) ? type : 0;
		}
		return static_cast<content<T>*>(buf);
	}